

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Iterator * __thiscall
kj::_::
MappedIterable<kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>_&,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
::end(Iterator *__return_storage_ptr__,
     MappedIterable<kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>_&,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
     *this)

{
  Iterator inner;
  Iterator local_28;
  MappedIterable<kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>_&,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
  *local_10;
  MappedIterable<kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>_&,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
  *this_local;
  
  local_10 = this;
  TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>::end(&local_28,this->inner);
  inner.leaf = local_28.leaf;
  inner.tree = local_28.tree;
  inner.row = local_28.row;
  inner._20_4_ = local_28._20_4_;
  MappedIterator<kj::_::BTreeImpl::Iterator,kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>>
  ::MappedIterator<kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>&>
            ((MappedIterator<kj::_::BTreeImpl::Iterator,kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry>>
              *)__return_storage_ptr__,inner,
             &this->super_TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>);
  return __return_storage_ptr__;
}

Assistant:

inline Iterator end() { return { inner.end(), (Mapping&)*this }; }